

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

void fsg_model_write(fsg_model_t *fsg,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  fsg_arciter_t *itor;
  fsg_link_t *pfVar3;
  char *pcVar4;
  int i;
  
  pcVar4 = fsg->name;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "";
  }
  fprintf((FILE *)fp,"%s %s\n","FSG_BEGIN",pcVar4);
  fprintf((FILE *)fp,"%s %d\n","NUM_STATES",(ulong)(uint)fsg->n_state);
  fprintf((FILE *)fp,"%s %d\n","START_STATE",(ulong)(uint)fsg->start_state);
  fprintf((FILE *)fp,"%s %d\n","FINAL_STATE",(ulong)(uint)fsg->final_state);
  for (i = 0; i < fsg->n_state; i = i + 1) {
    for (itor = fsg_model_arcs(fsg,i); itor != (fsg_arciter_t *)0x0; itor = fsg_arciter_next(itor))
    {
      pfVar3 = fsg_arciter_get(itor);
      uVar1 = pfVar3->from_state;
      uVar2 = pfVar3->to_state;
      logmath_exp(fsg->lmath,(int)((float)pfVar3->logs2prob / (float)fsg->lw));
      pcVar4 = "";
      if (-1 < (long)pfVar3->wid) {
        pcVar4 = fsg->vocab[pfVar3->wid];
      }
      fprintf((FILE *)fp,"%s %d %d %f %s\n","TRANSITION",(ulong)uVar1,(ulong)uVar2,pcVar4);
    }
  }
  fprintf((FILE *)fp,"%s\n","FSG_END");
  fflush((FILE *)fp);
  return;
}

Assistant:

void
fsg_model_write(fsg_model_t * fsg, FILE * fp)
{
    int32 i;

    fprintf(fp, "%s %s\n", FSG_MODEL_BEGIN_DECL,
            fsg->name ? fsg->name : "");
    fprintf(fp, "%s %d\n", FSG_MODEL_NUM_STATES_DECL, fsg->n_state);
    fprintf(fp, "%s %d\n", FSG_MODEL_START_STATE_DECL, fsg->start_state);
    fprintf(fp, "%s %d\n", FSG_MODEL_FINAL_STATE_DECL, fsg->final_state);

    for (i = 0; i < fsg->n_state; i++) {
        fsg_arciter_t *itor;

        for (itor = fsg_model_arcs(fsg, i); itor;
             itor = fsg_arciter_next(itor)) {
            fsg_link_t *tl = fsg_arciter_get(itor);

            fprintf(fp, "%s %d %d %f %s\n", FSG_MODEL_TRANSITION_DECL,
                    tl->from_state, tl->to_state,
                    logmath_exp(fsg->lmath,
                                (int32) (tl->logs2prob / fsg->lw)),
                    (tl->wid < 0) ? "" : fsg_model_word_str(fsg, tl->wid));
        }
    }

    fprintf(fp, "%s\n", FSG_MODEL_END_DECL);

    fflush(fp);
}